

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O3

TransliteratorEntry *
icu_63::TransliteratorRegistry::findInBundle
          (TransliteratorSpec *specToOpen,TransliteratorSpec *specToFind,UnicodeString *variant,
          UTransDirection direction)

{
  short sVar1;
  ushort uVar2;
  ResourceBundle *this;
  bool bVar3;
  UChar *pUVar4;
  UBool UVar5;
  int iVar6;
  UnicodeString *pUVar7;
  CharString *pCVar8;
  Locale *pLVar9;
  TransliteratorEntry *pTVar10;
  undefined4 uVar11;
  UTransDirection UVar12;
  int32_t iVar13;
  bool bVar14;
  ResourceBundle subres;
  UnicodeString utag;
  UnicodeString s;
  UnicodeString resStr;
  UErrorCode local_284;
  TransliteratorSpec *local_280;
  UTransDirection local_274;
  UChar *local_270;
  ResourceBundle local_268;
  _func_int **local_250;
  UnicodeString *local_248;
  UnicodeString *local_240;
  UnicodeString *local_238;
  UChar *local_230;
  undefined1 *local_220;
  UnicodeString local_210;
  UnicodeString local_1d0;
  UnicodeString local_190;
  CharString local_150;
  Locale local_110;
  
  local_210.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_210.fUnion.fStackFields.fLengthAndFlags = 2;
  local_250 = (_func_int **)&PTR__UnicodeString_00487e70;
  local_190.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00487e70;
  local_190.fUnion.fStackFields.fLengthAndFlags = 2;
  local_270 = (UChar *)TRANSLITERATE_FROM;
  if (direction == UTRANS_FORWARD) {
    local_270 = (UChar *)TRANSLITERATE_TO;
  }
  local_238 = &specToFind->spec;
  local_248 = &specToOpen->spec;
  local_280 = specToOpen;
  local_274 = direction;
  local_240 = variant;
  bVar3 = true;
  do {
    if ((local_210.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      uVar11 = local_210.fUnion.fFields.fLength;
      if (-1 < local_210.fUnion.fStackFields.fLengthAndFlags) {
        uVar11 = (int)local_210.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (uVar11 != 0) {
        local_210.fUnion.fStackFields.fLengthAndFlags =
             local_210.fUnion.fStackFields.fLengthAndFlags & 0x1e;
      }
    }
    else {
      icu_63::UnicodeString::unBogus(&local_210);
    }
    pUVar4 = local_270;
    if (bVar3) {
      icu_63::UnicodeString::doAppend(&local_210,local_270,0,-1);
      local_230 = pUVar4;
    }
    else {
      icu_63::UnicodeString::doAppend(&local_210,(UChar *)TRANSLITERATE,0,-1);
      local_220 = TRANSLITERATE;
    }
    icu_63::UnicodeString::UnicodeString(&local_1d0,local_238);
    Locale::Locale(&local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
    pUVar7 = icu_63::UnicodeString::toUpper(&local_1d0,&local_110);
    sVar1 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar13 = (pUVar7->fUnion).fFields.fLength;
    }
    else {
      iVar13 = (int)sVar1 >> 5;
    }
    icu_63::UnicodeString::doAppend(&local_210,pUVar7,0,iVar13);
    Locale::~Locale(&local_110);
    local_284 = U_ZERO_ERROR;
    this = local_280->res;
    MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)&local_110);
    local_110.fullNameBuffer[8] = '\0';
    local_110.fullNameBuffer[9] = '\0';
    local_110.fullNameBuffer[10] = '\0';
    local_110.fullNameBuffer[0xb] = '\0';
    *(undefined1 *)local_110.super_UObject._vptr_UObject = 0;
    pCVar8 = CharString::appendInvariantChars((CharString *)&local_110,&local_210,&local_284);
    ResourceBundle::get(&local_268,this,(pCVar8->buffer).ptr,&local_284);
    MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)&local_110);
    if (local_284 != U_USING_DEFAULT_WARNING && local_284 < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((local_1d0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
        uVar11 = local_1d0.fUnion.fFields.fLength;
        if (-1 < local_1d0.fUnion.fStackFields.fLengthAndFlags) {
          uVar11 = (int)local_1d0.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        if (uVar11 != 0) {
          local_1d0.fUnion.fStackFields.fLengthAndFlags =
               local_1d0.fUnion.fStackFields.fLengthAndFlags & 0x1e;
        }
      }
      else {
        icu_63::UnicodeString::unBogus(&local_1d0);
      }
      pLVar9 = ResourceBundle::getLocale(&local_268);
      pUVar7 = LocaleUtility::initNameFromLocale(pLVar9,&local_1d0);
      uVar2 = (local_280->spec).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar2 & 1) == 0) {
        if ((short)uVar2 < 0) {
          iVar6 = (local_280->spec).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)(short)uVar2 >> 5;
        }
        sVar1 = (pUVar7->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar13 = (pUVar7->fUnion).fFields.fLength;
        }
        else {
          iVar13 = (int)sVar1 >> 5;
        }
        if ((((int)sVar1 & 1U) != 0) || (iVar6 != iVar13)) goto LAB_0027934b;
        UVar5 = icu_63::UnicodeString::doEquals(local_248,pUVar7,iVar6);
        bVar14 = UVar5 != '\0';
      }
      else {
        bVar14 = (bool)(*(byte *)&pUVar7->fUnion & 1);
      }
      pUVar7 = local_240;
      if (bVar14 != false) {
        sVar1 = (local_240->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar6 = (local_240->fUnion).fFields.fLength;
        }
        else {
          iVar6 = (int)sVar1 >> 5;
        }
        local_284 = U_ZERO_ERROR;
        pLVar9 = &local_110;
        if (iVar6 == 0) {
          ResourceBundle::getStringEx((UnicodeString *)&local_110,&local_268,1,&local_284);
          icu_63::UnicodeString::moveFrom(&local_190,(UnicodeString *)&local_110);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_110);
        }
        else {
          MaybeStackArray<char,_40>::MaybeStackArray(&local_150.buffer);
          local_150.len = 0;
          *local_150.buffer.ptr = '\0';
          pCVar8 = CharString::appendInvariantChars(&local_150,pUVar7,&local_284);
          ResourceBundle::getStringEx
                    ((UnicodeString *)&local_110,&local_268,(pCVar8->buffer).ptr,&local_284);
          icu_63::UnicodeString::moveFrom(&local_190,(UnicodeString *)&local_110);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_110);
          MaybeStackArray<char,_40>::~MaybeStackArray(&local_150.buffer);
        }
        if (local_284 < U_ILLEGAL_ARGUMENT_ERROR) {
          ResourceBundle::~ResourceBundle(&local_268);
          icu_63::UnicodeString::~UnicodeString(&local_1d0);
          UVar12 = local_274;
          if (bVar3) {
            UVar12 = UTRANS_FORWARD;
          }
          pTVar10 = (TransliteratorEntry *)UMemory::operator_new((UMemory *)0x68,(size_t)pLVar9);
          if (pTVar10 == (TransliteratorEntry *)0x0) {
            pTVar10 = (TransliteratorEntry *)0x0;
          }
          else {
            (pTVar10->stringArg).super_Replaceable.super_UObject._vptr_UObject = local_250;
            (pTVar10->stringArg).fUnion.fStackFields.fLengthAndFlags = 2;
            pTVar10->compoundFilter = (UnicodeSet *)0x0;
            (pTVar10->u).prototype = (Transliterator *)0x0;
            pTVar10->entryType = LOCALE_RULES;
            icu_63::UnicodeString::operator=(&pTVar10->stringArg,&local_190);
            pTVar10->intArg = UVar12;
          }
          goto LAB_0027936e;
        }
      }
    }
LAB_0027934b:
    ResourceBundle::~ResourceBundle(&local_268);
    icu_63::UnicodeString::~UnicodeString(&local_1d0);
    pTVar10 = (TransliteratorEntry *)0x0;
    bVar14 = !bVar3;
    bVar3 = false;
    if (bVar14) {
LAB_0027936e:
      icu_63::UnicodeString::~UnicodeString(&local_190);
      icu_63::UnicodeString::~UnicodeString(&local_210);
      return pTVar10;
    }
  } while( true );
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::findInBundle(const TransliteratorSpec& specToOpen,
                                            const TransliteratorSpec& specToFind,
                                            const UnicodeString& variant,
                                            UTransDirection direction)
{
    UnicodeString utag;
    UnicodeString resStr;
    int32_t pass;

    for (pass=0; pass<2; ++pass) {
        utag.truncate(0);
        // First try either TransliteratorTo_xxx or
        // TransliterateFrom_xxx, then try the bidirectional
        // Transliterate_xxx.  This precedence order is arbitrary
        // but must be consistent and documented.
        if (pass == 0) {
            utag.append(direction == UTRANS_FORWARD ?
                        TRANSLITERATE_TO : TRANSLITERATE_FROM, -1);
        } else {
            utag.append(TRANSLITERATE, -1);
        }
        UnicodeString s(specToFind.get());
        utag.append(s.toUpper(""));
        UErrorCode status = U_ZERO_ERROR;
        ResourceBundle subres(specToOpen.getBundle().get(
            CharString().appendInvariantChars(utag, status).data(), status));
        if (U_FAILURE(status) || status == U_USING_DEFAULT_WARNING) {
            continue;
        }

        s.truncate(0);
        if (specToOpen.get() != LocaleUtility::initNameFromLocale(subres.getLocale(), s)) {
            continue;
        }

        if (variant.length() != 0) {
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(
                CharString().appendInvariantChars(variant, status).data(), status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        } else {
            // Variant is empty, which means match the first variant listed.
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(1, status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        }
    }

    if (pass==2) {
        // Failed
        return NULL;
    }

    // We have succeeded in loading a string from the locale
    // resources.  Create a new registry entry to hold it and return it.
    TransliteratorEntry *entry = new TransliteratorEntry();
    if (entry != 0) {
        // The direction is always forward for the
        // TransliterateTo_xxx and TransliterateFrom_xxx
        // items; those are unidirectional forward rules.
        // For the bidirectional Transliterate_xxx items,
        // the direction is the value passed in to this
        // function.
        int32_t dir = (pass == 0) ? UTRANS_FORWARD : direction;
        entry->entryType = TransliteratorEntry::LOCALE_RULES;
        entry->stringArg = resStr;
        entry->intArg = dir;
    }

    return entry;
}